

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_crop.cpp
# Opt level: O3

int main(void)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int extraout_EDX;
  int extraout_EDX_00;
  int extraout_EDX_01;
  int extraout_EDX_02;
  int extraout_EDX_03;
  int extraout_EDX_04;
  int extraout_EDX_05;
  int extraout_EDX_06;
  int extraout_EDX_07;
  int extraout_EDX_08;
  int extraout_EDX_09;
  int extraout_EDX_10;
  int extraout_EDX_11;
  int extraout_EDX_12;
  int extraout_EDX_13;
  int extraout_EDX_14;
  int extraout_EDX_15;
  int extraout_EDX_16;
  int extraout_EDX_17;
  int extraout_EDX_18;
  int extraout_EDX_19;
  int extraout_EDX_20;
  int extraout_EDX_21;
  int extraout_EDX_22;
  int extraout_EDX_23;
  int extraout_EDX_24;
  int extraout_EDX_25;
  int extraout_EDX_26;
  int extraout_EDX_27;
  int extraout_EDX_28;
  int extraout_EDX_29;
  int extraout_EDX_30;
  uint64_t uVar8;
  long lVar9;
  uint_fast16_t uVar10;
  ulong uVar11;
  bool bVar12;
  undefined1 auVar13 [16];
  Mat local_678;
  void *ptr_23;
  void *ptr_21;
  int *local_628;
  size_t local_620;
  int local_618;
  Allocator *local_610;
  undefined8 local_608;
  undefined8 uStack_600;
  size_t local_5f8;
  void *ptr_20;
  int *local_5e8;
  size_t local_5e0;
  int local_5d8;
  Allocator *local_5d0;
  undefined8 local_5c8;
  undefined8 uStack_5c0;
  size_t local_5b8;
  void *ptr_18;
  int *local_5a8;
  size_t local_5a0;
  int local_598;
  Allocator *local_590;
  undefined8 local_588;
  undefined8 uStack_580;
  size_t local_578;
  void *ptr_17;
  int *local_568;
  size_t local_560;
  int local_558;
  Allocator *local_550;
  undefined8 local_548;
  undefined8 uStack_540;
  size_t local_538;
  void *ptr_15;
  int *local_528;
  size_t local_520;
  int local_518;
  Allocator *local_510;
  undefined8 local_508;
  undefined8 uStack_500;
  size_t local_4f8;
  void *ptr_14;
  int *local_4e8;
  size_t local_4e0;
  int local_4d8;
  Allocator *local_4d0;
  undefined8 local_4c8;
  undefined8 uStack_4c0;
  size_t local_4b8;
  void *ptr_12;
  int *local_4a8;
  size_t local_4a0;
  int local_498;
  Allocator *local_490;
  undefined8 local_488;
  undefined8 uStack_480;
  size_t local_478;
  void *ptr_11;
  int *local_468;
  size_t local_460;
  int local_458;
  Allocator *local_450;
  undefined8 local_448;
  undefined8 uStack_440;
  size_t local_438;
  void *ptr_9;
  int *local_428;
  size_t local_420;
  int local_418;
  Allocator *local_410;
  undefined8 local_408;
  undefined8 uStack_400;
  size_t local_3f8;
  void *ptr_8;
  int *local_3e8;
  size_t local_3e0;
  int local_3d8;
  Allocator *local_3d0;
  undefined8 local_3c8;
  undefined8 uStack_3c0;
  size_t local_3b8;
  void *ptr_6;
  int *local_3a8;
  size_t local_3a0;
  int local_398;
  Allocator *local_390;
  undefined8 local_388;
  undefined8 uStack_380;
  size_t local_378;
  void *ptr_5;
  int *local_368;
  size_t local_360;
  int local_358;
  Allocator *local_350;
  undefined8 local_348;
  undefined8 uStack_340;
  size_t local_338;
  void *ptr_3;
  int *local_328;
  size_t local_320;
  int local_318;
  Allocator *local_310;
  undefined8 local_308;
  undefined8 uStack_300;
  size_t local_2f8;
  void *ptr_2;
  int *local_2e8;
  size_t local_2e0;
  int local_2d8;
  Allocator *local_2d0;
  undefined8 local_2c8;
  undefined8 uStack_2c0;
  size_t local_2b8;
  void *ptr;
  int *local_2a8;
  size_t local_2a0;
  int local_298;
  Allocator *local_290;
  undefined8 local_288;
  undefined8 uStack_280;
  size_t local_278;
  void *ptr_22;
  int *local_268;
  size_t local_260;
  int local_258;
  Allocator *local_250;
  undefined8 local_248;
  undefined8 uStack_240;
  size_t local_238;
  void *ptr_19;
  int *local_228;
  size_t local_220;
  int local_218;
  Allocator *local_210;
  undefined8 local_208;
  undefined8 uStack_200;
  size_t local_1f8;
  void *ptr_16;
  int *local_1e8;
  size_t local_1e0;
  int local_1d8;
  Allocator *local_1d0;
  undefined8 local_1c8;
  undefined8 uStack_1c0;
  size_t local_1b8;
  void *ptr_13;
  int *local_1a8;
  size_t local_1a0;
  int local_198;
  Allocator *local_190;
  undefined8 local_188;
  undefined8 uStack_180;
  size_t local_178;
  void *ptr_10;
  int *local_168;
  size_t local_160;
  int local_158;
  Allocator *local_150;
  undefined8 local_148;
  undefined8 uStack_140;
  size_t local_138;
  void *ptr_7;
  int *local_128;
  size_t local_120;
  int local_118;
  Allocator *local_110;
  undefined8 local_108;
  undefined8 uStack_100;
  size_t local_f8;
  void *ptr_4;
  int *local_e8;
  size_t local_e0;
  int local_d8;
  Allocator *local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  size_t local_b8;
  void *ptr_1;
  int *local_a8;
  size_t local_a0;
  int local_98;
  Allocator *local_90;
  undefined8 local_88;
  undefined8 uStack_80;
  size_t local_78;
  Mat m;
  
  auVar3 = _DAT_00170020;
  auVar2 = _DAT_00170010;
  g_prng_rand_state.c = 0x37;
  g_prng_rand_state.i = 0;
  g_prng_rand_state.s[0] = 0x7685dd;
  uVar8 = 0x1007685db;
  lVar9 = 0;
  do {
    auVar13._8_4_ = (int)lVar9;
    auVar13._0_8_ = lVar9;
    auVar13._12_4_ = (int)((ulong)lVar9 >> 0x20);
    auVar13 = (auVar13 | auVar2) ^ auVar3;
    if (auVar13._4_4_ == -0x80000000 && auVar13._0_4_ < -0x7fffffc1) {
      g_prng_rand_state.s[lVar9 + 1] = uVar8 - 0x7fffffff;
      g_prng_rand_state.s[lVar9 + 2] = uVar8;
    }
    lVar9 = lVar9 + 2;
    uVar8 = uVar8 + 0xfffffffe;
  } while (lVar9 != 0x40);
  lVar9 = 0;
  do {
    uVar10 = g_prng_rand_state.i;
    uVar11 = 0;
    do {
      iVar5 = (int)uVar10;
      iVar4 = (int)uVar11;
      uVar1 = uVar11 + 1;
      g_prng_rand_state.s[iVar5 + iVar4 & 0x3f] =
           g_prng_rand_state.s[iVar5 + iVar4 + 9U & 0x3f] +
           g_prng_rand_state.s[iVar5 + iVar4 + 0x28U & 0x3f];
      if (g_prng_rand_state.c != 0) break;
      bVar12 = uVar11 < 0x1ef;
      uVar11 = uVar1;
    } while (bVar12);
    bVar12 = g_prng_rand_state.c == 0;
    g_prng_rand_state.c = g_prng_rand_state.c - 1;
    if (bVar12) {
      g_prng_rand_state.c = 0x36;
    }
    lVar9 = lVar9 + 1;
    g_prng_rand_state.i = uVar10 + uVar1;
  } while (lVar9 != 10000);
  g_prng_rand_state.i = uVar10 + uVar1;
  RandomMat(&local_678,0x10,10000,(int)g_prng_rand_state.c);
  iVar6 = 0;
  iVar4 = test_crop(&local_678,0,0,0,-0xe9,-0xe9,-0xe9,0,0,0);
  bVar12 = false;
  iVar5 = extraout_EDX;
  if (iVar4 == 0) {
    iVar6 = 0;
    iVar4 = test_crop(&local_678,0,3,0,10,-0xe9,-0xe9,0,0,0);
    bVar12 = false;
    iVar5 = extraout_EDX_00;
    if (iVar4 == 0) {
      iVar6 = 0;
      iVar4 = test_crop(&local_678,5,0,0,-0xe9,6,-0xe9,0,0,0);
      bVar12 = false;
      iVar5 = extraout_EDX_01;
      if (iVar4 == 0) {
        iVar6 = 0;
        iVar4 = test_crop(&local_678,5,3,0,-0xe9,-0xe9,0xc,0,0,0);
        bVar12 = false;
        iVar5 = extraout_EDX_02;
        if (iVar4 == 0) {
          iVar6 = 4;
          iVar4 = test_crop(&local_678,0,3,4,7,-0xe9,8,0,0,0);
          bVar12 = false;
          iVar5 = extraout_EDX_03;
          if (iVar4 == 0) {
            iVar6 = 5;
            iVar4 = test_crop(&local_678,5,0,5,4,-0xe9,4,0,0,0);
            bVar12 = false;
            iVar5 = extraout_EDX_04;
            if (iVar4 == 0) {
              iVar6 = 6;
              iVar4 = test_crop(&local_678,5,3,6,2,7,9,0,0,0);
              bVar12 = false;
              iVar5 = extraout_EDX_05;
              if (iVar4 == 0) {
                iVar6 = 4;
                iVar4 = test_crop(&local_678,0,3,4,-0xe9,4,5,0,0,0);
                bVar12 = false;
                iVar5 = extraout_EDX_06;
                if (iVar4 == 0) {
                  iVar6 = 5;
                  iVar4 = test_crop(&local_678,5,0,5,6,6,8,0,0,0);
                  bVar12 = false;
                  iVar5 = extraout_EDX_07;
                  if (iVar4 == 0) {
                    iVar6 = 6;
                    iVar5 = test_crop(&local_678,5,3,6,4,4,4,0,0,0);
                    bVar12 = iVar5 == 0;
                    iVar5 = extraout_EDX_08;
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  if (local_678.refcount != (int *)0x0) {
    LOCK();
    *local_678.refcount = *local_678.refcount + -1;
    UNLOCK();
    if (*local_678.refcount == 0) {
      if (local_678.allocator == (Allocator *)0x0) {
        if (local_678.data != (void *)0x0) {
          free(local_678.data);
          iVar5 = extraout_EDX_10;
        }
      }
      else {
        (**(code **)(*(long *)local_678.allocator + 0x18))();
        iVar5 = extraout_EDX_09;
      }
    }
  }
  iVar4 = 1;
  if (!bVar12) {
    return 1;
  }
  RandomMat(&local_678,0x10,iVar5,iVar6);
  iVar7 = 0;
  iVar6 = test_crop(&local_678,0,0,0,-0xe9,-0xe9,-0xe9,3,4,6);
  iVar5 = extraout_EDX_11;
  if (iVar6 == 0) {
    iVar7 = 0;
    iVar6 = test_crop(&local_678,0,3,0,10,-0xe9,-0xe9,0,3,4);
    iVar5 = extraout_EDX_12;
    if (iVar6 != 0) goto LAB_00112d3f;
    iVar7 = 0;
    iVar6 = test_crop(&local_678,5,0,0,-0xe9,6,-0xe9,5,0,2);
    iVar5 = extraout_EDX_13;
    if (iVar6 != 0) goto LAB_00112d3f;
    iVar7 = 0;
    iVar6 = test_crop(&local_678,5,3,0,-0xe9,-0xe9,0xc,2,1,1);
    iVar5 = extraout_EDX_14;
    if (iVar6 != 0) goto LAB_00112d3f;
    iVar7 = 4;
    iVar6 = test_crop(&local_678,0,3,4,7,-0xe9,8,3,4,4);
    bVar12 = false;
    iVar5 = extraout_EDX_23;
    if (iVar6 == 0) {
      iVar7 = 5;
      iVar6 = test_crop(&local_678,5,0,5,4,-0xe9,4,0,3,0);
      iVar5 = extraout_EDX_24;
      if (iVar6 == 0) {
        iVar7 = 6;
        iVar6 = test_crop(&local_678,5,3,6,2,7,9,1,2,3);
        iVar5 = extraout_EDX_25;
        if (iVar6 == 0) {
          iVar7 = 4;
          iVar5 = test_crop(&local_678,0,3,4,-0xe9,4,5,3,2,1);
          bVar12 = iVar5 == 0;
          iVar5 = extraout_EDX_26;
          goto LAB_00112d42;
        }
      }
      goto LAB_00112d3f;
    }
  }
  else {
LAB_00112d3f:
    bVar12 = false;
  }
LAB_00112d42:
  if (local_678.refcount != (int *)0x0) {
    LOCK();
    *local_678.refcount = *local_678.refcount + -1;
    UNLOCK();
    if (*local_678.refcount == 0) {
      if (local_678.allocator == (Allocator *)0x0) {
        if (local_678.data != (void *)0x0) {
          free(local_678.data);
          iVar5 = extraout_EDX_16;
        }
      }
      else {
        (**(code **)(*(long *)local_678.allocator + 0x18))();
        iVar5 = extraout_EDX_15;
      }
    }
  }
  if (!bVar12) {
    return 1;
  }
  RandomMat(&local_678,0x11,iVar5,iVar7);
  iVar7 = 0;
  iVar6 = test_crop(&local_678,0,0,0,-0xe9,-0xe9,-0xe9,3,4,6);
  iVar5 = extraout_EDX_17;
  if (iVar6 == 0) {
    iVar7 = 0;
    iVar6 = test_crop(&local_678,0,3,0,10,-0xe9,-0xe9,0,3,4);
    iVar5 = extraout_EDX_18;
    if (iVar6 == 0) {
      iVar7 = 0;
      iVar6 = test_crop(&local_678,5,0,0,-0xe9,6,-0xe9,5,0,2);
      iVar5 = extraout_EDX_19;
      if (iVar6 == 0) {
        iVar7 = 0;
        iVar6 = test_crop(&local_678,5,3,0,-0xe9,-0xe9,0xc,2,1,1);
        iVar5 = extraout_EDX_20;
        if (iVar6 == 0) {
          iVar7 = 4;
          iVar6 = test_crop(&local_678,0,3,4,7,-0xe9,8,3,4,4);
          bVar12 = false;
          iVar5 = extraout_EDX_27;
          if (iVar6 != 0) goto LAB_00112e58;
          iVar7 = 5;
          iVar6 = test_crop(&local_678,5,0,5,4,-0xe9,4,0,3,0);
          iVar5 = extraout_EDX_28;
          if (iVar6 == 0) {
            iVar7 = 6;
            iVar6 = test_crop(&local_678,5,3,6,2,7,9,1,2,3);
            iVar5 = extraout_EDX_29;
            if (iVar6 == 0) {
              iVar7 = 4;
              iVar5 = test_crop(&local_678,0,3,4,-0xe9,4,5,3,2,1);
              bVar12 = iVar5 == 0;
              iVar5 = extraout_EDX_30;
              goto LAB_00112e58;
            }
          }
        }
      }
    }
  }
  bVar12 = false;
LAB_00112e58:
  if (local_678.refcount != (int *)0x0) {
    LOCK();
    *local_678.refcount = *local_678.refcount + -1;
    UNLOCK();
    if (*local_678.refcount == 0) {
      if (local_678.allocator == (Allocator *)0x0) {
        if (local_678.data != (void *)0x0) {
          free(local_678.data);
          iVar5 = extraout_EDX_22;
        }
      }
      else {
        (**(code **)(*(long *)local_678.allocator + 0x18))();
        iVar5 = extraout_EDX_21;
      }
    }
  }
  if (bVar12) {
    RandomMat(&local_678,0x10,iVar5,iVar7);
    m.elemsize = 4;
    m.elempack = 1;
    m.allocator = (Allocator *)0x0;
    m.dims = 1;
    m.w = 3;
    m.h = 1;
    m.c = 1;
    m.cstep = 3;
    ptr = (void *)0x0;
    iVar5 = posix_memalign(&ptr,0x10,0x10);
    m.data = (undefined8 *)0x0;
    if (iVar5 == 0) {
      m.data = ptr;
    }
    m.refcount = (int *)((long)m.data + 0xc);
    *(undefined8 *)m.data = 0;
    *(undefined8 *)((long)m.data + 8) = 0x100000000;
    local_2a0 = 4;
    local_298 = 1;
    local_290 = (Allocator *)0x0;
    local_288._0_4_ = 1;
    local_288._4_4_ = 3;
    uStack_280._0_4_ = 1;
    uStack_280._4_4_ = 1;
    local_278 = 3;
    ptr_1 = (void *)0x0;
    iVar5 = posix_memalign(&ptr_1,0x10,0x10);
    ptr = (undefined8 *)0x0;
    if (iVar5 == 0) {
      ptr = ptr_1;
    }
    local_2a8 = (int *)((long)ptr + 0xc);
    *(undefined8 *)ptr = 0x6400000064;
    *(undefined8 *)((long)ptr + 8) = 0x100000064;
    local_a0 = 4;
    local_98 = 1;
    local_90 = (Allocator *)0x0;
    local_88._0_4_ = 1;
    local_88._4_4_ = 3;
    uStack_80._0_4_ = 1;
    uStack_80._4_4_ = 1;
    local_78 = 3;
    ptr_2 = (void *)0x0;
    iVar5 = posix_memalign(&ptr_2,0x10,0x10);
    ptr_1 = (undefined8 *)0x0;
    if (iVar5 == 0) {
      ptr_1 = ptr_2;
    }
    local_a8 = (int *)((long)ptr_1 + 0xc);
    *(undefined8 *)ptr_1 = 0x100000000;
    *(undefined8 *)((long)ptr_1 + 8) = 0x100000002;
    iVar5 = test_crop(&local_678,&m,(Mat *)&ptr,(Mat *)&ptr_1);
    if (iVar5 == 0) {
      local_2e0 = 4;
      local_2d8 = 1;
      local_2d0 = (Allocator *)0x0;
      local_2c8._0_4_ = 1;
      local_2c8._4_4_ = 1;
      uStack_2c0._0_4_ = 1;
      uStack_2c0._4_4_ = 1;
      local_2b8 = 1;
      ptr_3 = (void *)0x0;
      iVar5 = posix_memalign(&ptr_3,0x10,8);
      ptr_2 = (undefined8 *)0x0;
      if (iVar5 == 0) {
        ptr_2 = ptr_3;
      }
      local_2e8 = (int *)((long)ptr_2 + 4);
      *(undefined8 *)ptr_2 = 0x100000004;
      local_320 = 4;
      local_318 = 1;
      local_310 = (Allocator *)0x0;
      local_308._0_4_ = 1;
      local_308._4_4_ = 1;
      uStack_300._0_4_ = 1;
      uStack_300._4_4_ = 1;
      local_2f8 = 1;
      ptr_4 = (void *)0x0;
      iVar5 = posix_memalign(&ptr_4,0x10,8);
      ptr_3 = (undefined8 *)0x0;
      if (iVar5 == 0) {
        ptr_3 = ptr_4;
      }
      local_328 = (int *)((long)ptr_3 + 4);
      *(undefined8 *)ptr_3 = 0x100000008;
      local_e0 = 4;
      local_d8 = 1;
      local_d0 = (Allocator *)0x0;
      local_c8._0_4_ = 1;
      local_c8._4_4_ = 1;
      uStack_c0._0_4_ = 1;
      uStack_c0._4_4_ = 1;
      local_b8 = 1;
      ptr_5 = (void *)0x0;
      iVar5 = posix_memalign(&ptr_5,0x10,8);
      ptr_4 = (undefined8 *)0x0;
      if (iVar5 == 0) {
        ptr_4 = ptr_5;
      }
      local_e8 = (int *)((long)ptr_4 + 4);
      *(undefined8 *)ptr_4 = 0x100000000;
      iVar5 = test_crop(&local_678,(Mat *)&ptr_2,(Mat *)&ptr_3,(Mat *)&ptr_4);
      if (iVar5 == 0) {
        local_360 = 4;
        local_358 = 1;
        local_350 = (Allocator *)0x0;
        local_348._0_4_ = 1;
        local_348._4_4_ = 1;
        uStack_340._0_4_ = 1;
        uStack_340._4_4_ = 1;
        local_338 = 1;
        ptr_6 = (void *)0x0;
        iVar5 = posix_memalign(&ptr_6,0x10,8);
        ptr_5 = (undefined8 *)0x0;
        if (iVar5 == 0) {
          ptr_5 = ptr_6;
        }
        local_368 = (int *)((long)ptr_5 + 4);
        *(undefined8 *)ptr_5 = 0x100000002;
        local_3a0 = 4;
        local_398 = 1;
        local_390 = (Allocator *)0x0;
        local_388._0_4_ = 1;
        local_388._4_4_ = 1;
        uStack_380._0_4_ = 1;
        uStack_380._4_4_ = 1;
        local_378 = 1;
        ptr_7 = (void *)0x0;
        iVar5 = posix_memalign(&ptr_7,0x10,8);
        ptr_6 = (undefined8 *)0x0;
        if (iVar5 == 0) {
          ptr_6 = ptr_7;
        }
        local_3a8 = (int *)((long)ptr_6 + 4);
        *(undefined8 *)ptr_6 = 0x100000007;
        local_120 = 4;
        local_118 = 1;
        local_110 = (Allocator *)0x0;
        local_108._0_4_ = 1;
        local_108._4_4_ = 1;
        uStack_100._0_4_ = 1;
        uStack_100._4_4_ = 1;
        local_f8 = 1;
        ptr_8 = (void *)0x0;
        iVar5 = posix_memalign(&ptr_8,0x10,8);
        ptr_7 = (undefined8 *)0x0;
        if (iVar5 == 0) {
          ptr_7 = ptr_8;
        }
        local_128 = (int *)((long)ptr_7 + 4);
        *(undefined8 *)ptr_7 = 0x100000001;
        iVar5 = test_crop(&local_678,(Mat *)&ptr_5,(Mat *)&ptr_6,(Mat *)&ptr_7);
        if (iVar5 == 0) {
          local_3e0 = 4;
          local_3d8 = 1;
          local_3d0 = (Allocator *)0x0;
          local_3c8._0_4_ = 1;
          local_3c8._4_4_ = 1;
          uStack_3c0._0_4_ = 1;
          uStack_3c0._4_4_ = 1;
          local_3b8 = 1;
          ptr_9 = (void *)0x0;
          iVar5 = posix_memalign(&ptr_9,0x10,8);
          ptr_8 = (undefined8 *)0x0;
          if (iVar5 == 0) {
            ptr_8 = ptr_9;
          }
          local_3e8 = (int *)((long)ptr_8 + 4);
          *(undefined8 *)ptr_8 = 0x100000003;
          local_420 = 4;
          local_418 = 1;
          local_410 = (Allocator *)0x0;
          local_408._0_4_ = 1;
          local_408._4_4_ = 1;
          uStack_400._0_4_ = 1;
          uStack_400._4_4_ = 1;
          local_3f8 = 1;
          ptr_10 = (void *)0x0;
          iVar5 = posix_memalign(&ptr_10,0x10,8);
          ptr_9 = (undefined8 *)0x0;
          if (iVar5 == 0) {
            ptr_9 = ptr_10;
          }
          local_428 = (int *)((long)ptr_9 + 4);
          *(undefined8 *)ptr_9 = 0x100000005;
          local_160 = 4;
          local_158 = 1;
          local_150 = (Allocator *)0x0;
          local_148._0_4_ = 1;
          local_148._4_4_ = 1;
          uStack_140._0_4_ = 1;
          uStack_140._4_4_ = 1;
          local_138 = 1;
          ptr_11 = (void *)0x0;
          iVar5 = posix_memalign(&ptr_11,0x10,8);
          ptr_10 = (undefined8 *)0x0;
          if (iVar5 == 0) {
            ptr_10 = ptr_11;
          }
          local_168 = (int *)((long)ptr_10 + 4);
          *(undefined8 *)ptr_10 = 0x100000002;
          iVar5 = test_crop(&local_678,(Mat *)&ptr_8,(Mat *)&ptr_9,(Mat *)&ptr_10);
          if (iVar5 == 0) {
            local_460 = 4;
            local_458 = 1;
            local_450 = (Allocator *)0x0;
            local_448._0_4_ = 1;
            local_448._4_4_ = 2;
            uStack_440._0_4_ = 1;
            uStack_440._4_4_ = 1;
            local_438 = 2;
            ptr_12 = (void *)0x0;
            iVar5 = posix_memalign(&ptr_12,0x10,0xc);
            ptr_11 = (undefined8 *)0x0;
            if (iVar5 == 0) {
              ptr_11 = ptr_12;
            }
            local_468 = (int *)((long)ptr_11 + 8);
            *(undefined4 *)((long)ptr_11 + 8) = 1;
            *(undefined8 *)ptr_11 = 0x100000002;
            local_4a0 = 4;
            local_498 = 1;
            local_490 = (Allocator *)0x0;
            local_488._0_4_ = 1;
            local_488._4_4_ = 2;
            uStack_480._0_4_ = 1;
            uStack_480._4_4_ = 1;
            local_478 = 2;
            ptr_13 = (void *)0x0;
            iVar5 = posix_memalign(&ptr_13,0x10,0xc);
            ptr_12 = (undefined8 *)0x0;
            if (iVar5 == 0) {
              ptr_12 = ptr_13;
            }
            local_4a8 = (int *)((long)ptr_12 + 8);
            *(undefined4 *)((long)ptr_12 + 8) = 1;
            *(undefined8 *)ptr_12 = 0xfffffffe00000004;
            local_1a0 = 4;
            local_198 = 1;
            local_190 = (Allocator *)0x0;
            local_188._0_4_ = 1;
            local_188._4_4_ = 2;
            uStack_180._0_4_ = 1;
            uStack_180._4_4_ = 1;
            local_178 = 2;
            ptr_14 = (void *)0x0;
            iVar5 = posix_memalign(&ptr_14,0x10,0xc);
            ptr_13 = (undefined8 *)0x0;
            if (iVar5 == 0) {
              ptr_13 = ptr_14;
            }
            local_1a8 = (int *)((long)ptr_13 + 8);
            *(undefined4 *)((long)ptr_13 + 8) = 1;
            *(undefined8 *)ptr_13 = 0x100000000;
            iVar5 = test_crop(&local_678,(Mat *)&ptr_11,(Mat *)&ptr_12,(Mat *)&ptr_13);
            if (iVar5 == 0) {
              local_4e0 = 4;
              local_4d8 = 1;
              local_4d0 = (Allocator *)0x0;
              local_4c8._0_4_ = 1;
              local_4c8._4_4_ = 2;
              uStack_4c0._0_4_ = 1;
              uStack_4c0._4_4_ = 1;
              local_4b8 = 2;
              ptr_15 = (void *)0x0;
              iVar5 = posix_memalign(&ptr_15,0x10,0xc);
              ptr_14 = (undefined8 *)0x0;
              if (iVar5 == 0) {
                ptr_14 = ptr_15;
              }
              local_4e8 = (int *)((long)ptr_14 + 8);
              *(undefined4 *)((long)ptr_14 + 8) = 1;
              *(undefined8 *)ptr_14 = 0x400000001;
              local_520 = 4;
              local_518 = 1;
              local_510 = (Allocator *)0x0;
              local_508._0_4_ = 1;
              local_508._4_4_ = 2;
              uStack_500._0_4_ = 1;
              uStack_500._4_4_ = 1;
              local_4f8 = 2;
              ptr_16 = (void *)0x0;
              iVar5 = posix_memalign(&ptr_16,0x10,0xc);
              ptr_15 = (undefined8 *)0x0;
              if (iVar5 == 0) {
                ptr_15 = ptr_16;
              }
              local_528 = (int *)((long)ptr_15 + 8);
              *(undefined4 *)((long)ptr_15 + 8) = 1;
              *(undefined8 *)ptr_15 = 0x7fffffffb;
              local_1e0 = 4;
              local_1d8 = 1;
              local_1d0 = (Allocator *)0x0;
              local_1c8._0_4_ = 1;
              local_1c8._4_4_ = 2;
              uStack_1c0._0_4_ = 1;
              uStack_1c0._4_4_ = 1;
              local_1b8 = 2;
              ptr_17 = (void *)0x0;
              iVar5 = posix_memalign(&ptr_17,0x10,0xc);
              ptr_16 = (undefined8 *)0x0;
              if (iVar5 == 0) {
                ptr_16 = ptr_17;
              }
              local_1e8 = (int *)((long)ptr_16 + 8);
              *(undefined4 *)((long)ptr_16 + 8) = 1;
              *(undefined8 *)ptr_16 = 0xfffffffd00000001;
              iVar5 = test_crop(&local_678,(Mat *)&ptr_14,(Mat *)&ptr_15,(Mat *)&ptr_16);
              if (iVar5 == 0) {
                local_560 = 4;
                local_558 = 1;
                local_550 = (Allocator *)0x0;
                local_548._0_4_ = 1;
                local_548._4_4_ = 2;
                uStack_540._0_4_ = 1;
                uStack_540._4_4_ = 1;
                local_538 = 2;
                ptr_18 = (void *)0x0;
                iVar5 = posix_memalign(&ptr_18,0x10,0xc);
                ptr_17 = (undefined8 *)0x0;
                if (iVar5 == 0) {
                  ptr_17 = ptr_18;
                }
                local_568 = (int *)((long)ptr_17 + 8);
                *(undefined4 *)((long)ptr_17 + 8) = 1;
                *(undefined8 *)ptr_17 = 0x100000002;
                local_5a0 = 4;
                local_598 = 1;
                local_590 = (Allocator *)0x0;
                local_588._0_4_ = 1;
                local_588._4_4_ = 2;
                uStack_580._0_4_ = 1;
                uStack_580._4_4_ = 1;
                local_578 = 2;
                ptr_19 = (void *)0x0;
                iVar5 = posix_memalign(&ptr_19,0x10,0xc);
                ptr_18 = (undefined8 *)0x0;
                if (iVar5 == 0) {
                  ptr_18 = ptr_19;
                }
                local_5a8 = (int *)((long)ptr_18 + 8);
                *(undefined4 *)((long)ptr_18 + 8) = 1;
                *(undefined8 *)ptr_18 = 0xfffffffe00000004;
                local_220 = 4;
                local_218 = 1;
                local_210 = (Allocator *)0x0;
                local_208._0_4_ = 1;
                local_208._4_4_ = 2;
                uStack_200._0_4_ = 1;
                uStack_200._4_4_ = 1;
                local_1f8 = 2;
                ptr_20 = (void *)0x0;
                iVar5 = posix_memalign(&ptr_20,0x10,0xc);
                ptr_19 = (undefined8 *)0x0;
                if (iVar5 == 0) {
                  ptr_19 = ptr_20;
                }
                local_228 = (int *)((long)ptr_19 + 8);
                *(undefined4 *)((long)ptr_19 + 8) = 1;
                *(undefined8 *)ptr_19 = 0xfffffffeffffffff;
                iVar5 = test_crop(&local_678,(Mat *)&ptr_17,(Mat *)&ptr_18,(Mat *)&ptr_19);
                if (iVar5 == 0) {
                  local_5e0 = 4;
                  local_5d8 = 1;
                  local_5d0 = (Allocator *)0x0;
                  local_5c8._0_4_ = 1;
                  local_5c8._4_4_ = 3;
                  uStack_5c0._0_4_ = 1;
                  uStack_5c0._4_4_ = 1;
                  local_5b8 = 3;
                  ptr_21 = (void *)0x0;
                  iVar5 = posix_memalign(&ptr_21,0x10,0x10);
                  ptr_20 = (undefined8 *)0x0;
                  if (iVar5 == 0) {
                    ptr_20 = ptr_21;
                  }
                  local_5e8 = (int *)((long)ptr_20 + 0xc);
                  *(undefined8 *)ptr_20 = 0x200000001;
                  *(undefined8 *)((long)ptr_20 + 8) = 0x100000003;
                  local_620 = 4;
                  local_618 = 1;
                  local_610 = (Allocator *)0x0;
                  local_608._0_4_ = 1;
                  local_608._4_4_ = 3;
                  uStack_600._0_4_ = 1;
                  uStack_600._4_4_ = 1;
                  local_5f8 = 3;
                  ptr_22 = (void *)0x0;
                  iVar5 = posix_memalign(&ptr_22,0x10,0x10);
                  ptr_21 = (undefined8 *)0x0;
                  if (iVar5 == 0) {
                    ptr_21 = ptr_22;
                  }
                  local_628 = (int *)((long)ptr_21 + 0xc);
                  *(undefined8 *)ptr_21 = 0xfffffffefffffffd;
                  *(undefined8 *)((long)ptr_21 + 8) = 0x1ffffffff;
                  local_260 = 4;
                  local_258 = 1;
                  local_250 = (Allocator *)0x0;
                  local_248._0_4_ = 1;
                  local_248._4_4_ = 3;
                  uStack_240._0_4_ = 1;
                  uStack_240._4_4_ = 1;
                  local_238 = 3;
                  ptr_23 = (void *)0x0;
                  iVar5 = posix_memalign(&ptr_23,0x10,0x10);
                  ptr_22 = (undefined8 *)0x0;
                  if (iVar5 == 0) {
                    ptr_22 = ptr_23;
                  }
                  local_268 = (int *)((long)ptr_22 + 0xc);
                  *(undefined8 *)ptr_22 = 0xfffffffefffffffd;
                  *(undefined8 *)((long)ptr_22 + 8) = 0x1ffffffff;
                  iVar5 = test_crop(&local_678,(Mat *)&ptr_20,(Mat *)&ptr_21,(Mat *)&ptr_22);
                  bVar12 = iVar5 == 0;
                  if (local_268 != (int *)0x0) {
                    LOCK();
                    *local_268 = *local_268 + -1;
                    UNLOCK();
                    if (*local_268 == 0) {
                      if (local_250 == (Allocator *)0x0) {
                        if (ptr_22 != (void *)0x0) {
                          free(ptr_22);
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_250 + 0x18))();
                      }
                    }
                  }
                  if (local_628 != (int *)0x0) {
                    LOCK();
                    *local_628 = *local_628 + -1;
                    UNLOCK();
                    if (*local_628 == 0) {
                      if (local_610 == (Allocator *)0x0) {
                        if (ptr_21 != (void *)0x0) {
                          free(ptr_21);
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_610 + 0x18))();
                      }
                    }
                  }
                  if (local_5e8 != (int *)0x0) {
                    LOCK();
                    *local_5e8 = *local_5e8 + -1;
                    UNLOCK();
                    if (*local_5e8 == 0) {
                      if (local_5d0 == (Allocator *)0x0) {
                        if (ptr_20 != (void *)0x0) {
                          free(ptr_20);
                        }
                      }
                      else {
                        (**(code **)(*(long *)local_5d0 + 0x18))();
                      }
                    }
                  }
                }
                else {
                  bVar12 = false;
                }
                if (local_228 != (int *)0x0) {
                  LOCK();
                  *local_228 = *local_228 + -1;
                  UNLOCK();
                  if (*local_228 == 0) {
                    if (local_210 == (Allocator *)0x0) {
                      if (ptr_19 != (void *)0x0) {
                        free(ptr_19);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_210 + 0x18))();
                    }
                  }
                }
                if (local_5a8 != (int *)0x0) {
                  LOCK();
                  *local_5a8 = *local_5a8 + -1;
                  UNLOCK();
                  if (*local_5a8 == 0) {
                    if (local_590 == (Allocator *)0x0) {
                      if (ptr_18 != (void *)0x0) {
                        free(ptr_18);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_590 + 0x18))();
                    }
                  }
                }
                if (local_568 != (int *)0x0) {
                  LOCK();
                  *local_568 = *local_568 + -1;
                  UNLOCK();
                  if (*local_568 == 0) {
                    if (local_550 == (Allocator *)0x0) {
                      if (ptr_17 != (void *)0x0) {
                        free(ptr_17);
                      }
                    }
                    else {
                      (**(code **)(*(long *)local_550 + 0x18))();
                    }
                  }
                }
              }
              else {
                bVar12 = false;
              }
              if (local_1e8 != (int *)0x0) {
                LOCK();
                *local_1e8 = *local_1e8 + -1;
                UNLOCK();
                if (*local_1e8 == 0) {
                  if (local_1d0 == (Allocator *)0x0) {
                    if (ptr_16 != (void *)0x0) {
                      free(ptr_16);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_1d0 + 0x18))();
                  }
                }
              }
              if (local_528 != (int *)0x0) {
                LOCK();
                *local_528 = *local_528 + -1;
                UNLOCK();
                if (*local_528 == 0) {
                  if (local_510 == (Allocator *)0x0) {
                    if (ptr_15 != (void *)0x0) {
                      free(ptr_15);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_510 + 0x18))();
                  }
                }
              }
              if (local_4e8 != (int *)0x0) {
                LOCK();
                *local_4e8 = *local_4e8 + -1;
                UNLOCK();
                if (*local_4e8 == 0) {
                  if (local_4d0 == (Allocator *)0x0) {
                    if (ptr_14 != (void *)0x0) {
                      free(ptr_14);
                    }
                  }
                  else {
                    (**(code **)(*(long *)local_4d0 + 0x18))();
                  }
                }
              }
            }
            else {
              bVar12 = false;
            }
            if (local_1a8 != (int *)0x0) {
              LOCK();
              *local_1a8 = *local_1a8 + -1;
              UNLOCK();
              if (*local_1a8 == 0) {
                if (local_190 == (Allocator *)0x0) {
                  if (ptr_13 != (void *)0x0) {
                    free(ptr_13);
                  }
                }
                else {
                  (**(code **)(*(long *)local_190 + 0x18))();
                }
              }
            }
            if (local_4a8 != (int *)0x0) {
              LOCK();
              *local_4a8 = *local_4a8 + -1;
              UNLOCK();
              if (*local_4a8 == 0) {
                if (local_490 == (Allocator *)0x0) {
                  if (ptr_12 != (void *)0x0) {
                    free(ptr_12);
                  }
                }
                else {
                  (**(code **)(*(long *)local_490 + 0x18))();
                }
              }
            }
            if (local_468 != (int *)0x0) {
              LOCK();
              *local_468 = *local_468 + -1;
              UNLOCK();
              if (*local_468 == 0) {
                if (local_450 == (Allocator *)0x0) {
                  if (ptr_11 != (void *)0x0) {
                    free(ptr_11);
                  }
                }
                else {
                  (**(code **)(*(long *)local_450 + 0x18))();
                }
              }
            }
          }
          else {
            bVar12 = false;
          }
          if (local_168 != (int *)0x0) {
            LOCK();
            *local_168 = *local_168 + -1;
            UNLOCK();
            if (*local_168 == 0) {
              if (local_150 == (Allocator *)0x0) {
                if (ptr_10 != (void *)0x0) {
                  free(ptr_10);
                }
              }
              else {
                (**(code **)(*(long *)local_150 + 0x18))();
              }
            }
          }
          if (local_428 != (int *)0x0) {
            LOCK();
            *local_428 = *local_428 + -1;
            UNLOCK();
            if (*local_428 == 0) {
              if (local_410 == (Allocator *)0x0) {
                if (ptr_9 != (void *)0x0) {
                  free(ptr_9);
                }
              }
              else {
                (**(code **)(*(long *)local_410 + 0x18))();
              }
            }
          }
          if (local_3e8 != (int *)0x0) {
            LOCK();
            *local_3e8 = *local_3e8 + -1;
            UNLOCK();
            if (*local_3e8 == 0) {
              if (local_3d0 == (Allocator *)0x0) {
                if (ptr_8 != (void *)0x0) {
                  free(ptr_8);
                }
              }
              else {
                (**(code **)(*(long *)local_3d0 + 0x18))();
              }
            }
          }
        }
        else {
          bVar12 = false;
        }
        if (local_128 != (int *)0x0) {
          LOCK();
          *local_128 = *local_128 + -1;
          UNLOCK();
          if (*local_128 == 0) {
            if (local_110 == (Allocator *)0x0) {
              if (ptr_7 != (void *)0x0) {
                free(ptr_7);
              }
            }
            else {
              (**(code **)(*(long *)local_110 + 0x18))();
            }
          }
        }
        if (local_3a8 != (int *)0x0) {
          LOCK();
          *local_3a8 = *local_3a8 + -1;
          UNLOCK();
          if (*local_3a8 == 0) {
            if (local_390 == (Allocator *)0x0) {
              if (ptr_6 != (void *)0x0) {
                free(ptr_6);
              }
            }
            else {
              (**(code **)(*(long *)local_390 + 0x18))();
            }
          }
        }
        if (local_368 != (int *)0x0) {
          LOCK();
          *local_368 = *local_368 + -1;
          UNLOCK();
          if (*local_368 == 0) {
            if (local_350 == (Allocator *)0x0) {
              if (ptr_5 != (void *)0x0) {
                free(ptr_5);
              }
            }
            else {
              (**(code **)(*(long *)local_350 + 0x18))();
            }
          }
        }
      }
      else {
        bVar12 = false;
      }
      if (local_e8 != (int *)0x0) {
        LOCK();
        *local_e8 = *local_e8 + -1;
        UNLOCK();
        if (*local_e8 == 0) {
          if (local_d0 == (Allocator *)0x0) {
            if (ptr_4 != (void *)0x0) {
              free(ptr_4);
            }
          }
          else {
            (**(code **)(*(long *)local_d0 + 0x18))();
          }
        }
      }
      if (local_328 != (int *)0x0) {
        LOCK();
        *local_328 = *local_328 + -1;
        UNLOCK();
        if (*local_328 == 0) {
          if (local_310 == (Allocator *)0x0) {
            if (ptr_3 != (void *)0x0) {
              free(ptr_3);
            }
          }
          else {
            (**(code **)(*(long *)local_310 + 0x18))();
          }
        }
      }
      if (local_2e8 != (int *)0x0) {
        LOCK();
        *local_2e8 = *local_2e8 + -1;
        UNLOCK();
        if (*local_2e8 == 0) {
          if (local_2d0 == (Allocator *)0x0) {
            if (ptr_2 != (void *)0x0) {
              free(ptr_2);
            }
          }
          else {
            (**(code **)(*(long *)local_2d0 + 0x18))();
          }
        }
      }
    }
    else {
      bVar12 = false;
    }
    if (local_a8 != (int *)0x0) {
      LOCK();
      *local_a8 = *local_a8 + -1;
      UNLOCK();
      if (*local_a8 == 0) {
        if (local_90 == (Allocator *)0x0) {
          if (ptr_1 != (void *)0x0) {
            free(ptr_1);
          }
        }
        else {
          (**(code **)(*(long *)local_90 + 0x18))();
        }
      }
    }
    if (local_2a8 != (int *)0x0) {
      LOCK();
      *local_2a8 = *local_2a8 + -1;
      UNLOCK();
      if (*local_2a8 == 0) {
        if (local_290 == (Allocator *)0x0) {
          if (ptr != (void *)0x0) {
            free(ptr);
          }
        }
        else {
          (**(code **)(*(long *)local_290 + 0x18))();
        }
      }
    }
    if (m.refcount != (int *)0x0) {
      LOCK();
      *m.refcount = *m.refcount + -1;
      UNLOCK();
      if (*m.refcount == 0) {
        if (m.allocator == (Allocator *)0x0) {
          if (m.data != (void *)0x0) {
            free(m.data);
          }
        }
        else {
          (**(code **)(*(long *)m.allocator + 0x18))();
        }
      }
    }
    if (local_678.refcount != (int *)0x0) {
      LOCK();
      *local_678.refcount = *local_678.refcount + -1;
      UNLOCK();
      if (*local_678.refcount == 0) {
        if (local_678.allocator == (Allocator *)0x0) {
          if (local_678.data != (void *)0x0) {
            free(local_678.data);
          }
        }
        else {
          (**(code **)(*(long *)local_678.allocator + 0x18))();
        }
      }
    }
    iVar4 = 1;
    if (bVar12) {
      iVar4 = test_crop_4();
    }
  }
  return iVar4;
}

Assistant:

int main()
{
    SRAND(7767517);

    return 0
        || test_crop_0()
        || test_crop_1()
        || test_crop_2()
        || test_crop_3()
        || test_crop_4()
        ;
}